

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementShellBST::~ChElementShellBST(ChElementShellBST *this)

{
  ~ChElementShellBST((ChElementShellBST *)
                     ((long)this->nodes_used_to_six +
                     (long)((this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                            _vptr_ChElementBase[-3] + -0x5c)));
  return;
}

Assistant:

void ChElementShellBST::SetNodes(std::shared_ptr<ChNodeFEAxyz> node0,
                  std::shared_ptr<ChNodeFEAxyz> node1,
                  std::shared_ptr<ChNodeFEAxyz> node2,
                  std::shared_ptr<ChNodeFEAxyz> node3,
				  std::shared_ptr<ChNodeFEAxyz> node4,
			      std::shared_ptr<ChNodeFEAxyz> node5) {
    assert(node0);
    assert(node1);
    assert(node2);


    m_nodes[0] = node0;
    m_nodes[1] = node1;
    m_nodes[2] = node2;
    m_nodes[3] = node3;
	m_nodes[4] = node4;
	m_nodes[5] = node5;

	this->n_usednodes = 3;
	nodes_used_to_six[0] = 0;
	nodes_used_to_six[1] = 1;
	nodes_used_to_six[2] = 2;
	if (node3 != nullptr) {
		nodes_used_to_six[n_usednodes] = 3;
		++n_usednodes;
	}
	if (node4 != nullptr) {
		nodes_used_to_six[n_usednodes] = 4;
		++n_usednodes;
	}
	if (node5 != nullptr) {
		nodes_used_to_six[n_usednodes] = 5;
		++n_usednodes;
	}

    std::vector<ChVariables*> mvars;
    mvars.push_back(&m_nodes[0]->Variables());
    mvars.push_back(&m_nodes[1]->Variables());
    mvars.push_back(&m_nodes[2]->Variables());
	if (node3 != nullptr)
		mvars.push_back(&m_nodes[3]->Variables());
	if (node4 != nullptr)
		mvars.push_back(&m_nodes[4]->Variables());
	if (node5 != nullptr)
		mvars.push_back(&m_nodes[5]->Variables());
    Kmatr.SetVariables(mvars);
}